

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O1

void __thiscall soplex::SPxLPBase<double>::doRemoveRows(SPxLPBase<double> *this,int *perm)

{
  long lVar1;
  int iVar2;
  Item *pIVar3;
  Nonzero<double> *pNVar4;
  bool bVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  
  lVar10 = (long)(this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum;
  LPRowSetBase<double>::remove(&this->super_LPRowSetBase<double>,(char *)perm);
  if (0 < lVar10) {
    lVar6 = 0;
    do {
      pIVar3 = (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.theitem;
      iVar2 = (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thekey[lVar6].idx;
      lVar7 = (long)pIVar3[iVar2].data.super_SVectorBase<double>.memused;
      if (0 < lVar7) {
        pIVar3 = pIVar3 + iVar2;
        lVar8 = lVar7 * 0x10 + -8;
        do {
          pNVar4 = (pIVar3->data).super_SVectorBase<double>.m_elem;
          if (perm[*(int *)((long)&pNVar4->val + lVar8)] < 0) {
            lVar9 = (long)(pIVar3->data).super_SVectorBase<double>.memused;
            lVar1 = lVar9 + -1;
            (pIVar3->data).super_SVectorBase<double>.memused = (int)lVar1;
            if (lVar7 < lVar9) {
              *(int *)((long)&pNVar4->val + lVar8) = pNVar4[lVar1].idx;
              *(double *)((long)pNVar4 + lVar8 + -8) = pNVar4[lVar1].val;
            }
          }
          else {
            *(int *)((long)&pNVar4->val + lVar8) = perm[*(int *)((long)&pNVar4->val + lVar8)];
          }
          lVar8 = lVar8 + -0x10;
          bVar5 = 1 < lVar7;
          lVar7 = lVar7 + -1;
        } while (bVar5);
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != lVar10);
  }
  return;
}

Assistant:

virtual void doRemoveRows(int perm[])
   {
      int j = nCols();

      LPRowSetBase<R>::remove(perm);

      for(int i = 0; i < j; ++i)
      {
         SVectorBase<R>& vec = colVector_w(i);

         for(int k = vec.size() - 1; k >= 0; --k)
         {
            int idx = vec.index(k);

            if(perm[idx] < 0)
               vec.remove(k);
            else
               vec.index(k) = perm[idx];
         }
      }
   }